

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O2

long __thiscall duckdb::BinaryDeserializer::VarIntDecode<long>(BinaryDeserializer *this)

{
  uint8_t *puVar1;
  long lVar2;
  uint8_t buffer [16];
  long value;
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  lVar2 = 0;
  do {
    if (lVar2 == 0x10) break;
    puVar1 = buffer + lVar2;
    (**this->stream->_vptr_ReadStream)(this->stream,puVar1,1);
    lVar2 = lVar2 + 1;
  } while ((char)*puVar1 < '\0');
  EncodingUtil::DecodeSignedLEB128<long>(buffer,&value);
  return value;
}

Assistant:

T VarIntDecode() {
		// FIXME: maybe we should pass a source to EncodingUtil instead
		uint8_t buffer[16] = {};
		idx_t varint_size;
		for (varint_size = 0; varint_size < 16; varint_size++) {
			ReadData(buffer + varint_size, 1);
			if (!(buffer[varint_size] & 0x80)) {
				varint_size++;
				break;
			}
		}
		T value;
		auto read_size = EncodingUtil::DecodeLEB128<T>(buffer, value);
		D_ASSERT(read_size == varint_size);
		(void)read_size;
		return value;
	}